

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

bool ValidatePlayerClass(PClassActor *ti,char *name)

{
  PClassActor *pPVar1;
  char *format;
  
  if (ti == (PClassActor *)0x0) {
    format = "Unknown player class \'%s\'\n";
  }
  else {
    pPVar1 = ti;
    if ((PClassActor *)APlayerPawn::RegistrationInfo.MyClass != ti) {
      do {
        pPVar1 = (PClassActor *)(pPVar1->super_PClass).ParentClass;
        if (pPVar1 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) break;
      } while (pPVar1 != (PClassActor *)0x0);
      if (pPVar1 == (PClassActor *)0x0) {
        format = "Invalid player class \'%s\'\n";
        goto LAB_0046557e;
      }
    }
    if (*(int *)(*(long *)&ti[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase + -0xc) != 0) {
      return true;
    }
    format = "Missing displayname for player class \'%s\'\n";
  }
LAB_0046557e:
  Printf(format);
  return false;
}

Assistant:

bool ValidatePlayerClass(PClassActor *ti, const char *name)
{
	if (ti == NULL)
	{
		Printf("Unknown player class '%s'\n", name);
		return false;
	}
	else if (!ti->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
	{
		Printf("Invalid player class '%s'\n", name);
		return false;
	}
	else if (static_cast<PClassPlayerPawn *>(ti)->DisplayName.IsEmpty())
	{
		Printf ("Missing displayname for player class '%s'\n", name);
		return false;
	}
	return true;
}